

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O2

void __thiscall tst_RootIndexProxyModel::bug53Rows(tst_RootIndexProxyModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ModelTest *pMVar4;
  ComplexModel baseModel;
  RootIndexProxyModel proxyModel2;
  RootIndexProxyModel proxyModel1;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  QSignalSpy proxy1RowsAboutToBeInsertedSpy;
  QSignalSpy proxy1RowsInsertedSpy;
  QSignalSpy proxy2RowsAboutToBeInsertedSpy;
  QSignalSpy proxy2RowsInsertedSpy;
  QSignalSpy proxy1RowsAboutToBeRemovedSpy;
  QSignalSpy proxy2rowsAboutToBeMovedSpy;
  QSignalSpy proxy2rowsMovedSpy;
  QSignalSpy proxy1rowsAboutToBeMovedSpy;
  QSignalSpy proxy1rowsMovedSpy;
  QSignalSpy proxy2RowsRemovedSpy;
  QSignalSpy proxy2RowsAboutToBeRemovedSpy;
  QSignalSpy proxy1RowsRemovedSpy;
  
  QStandardItemModel::QStandardItemModel(&baseModel,(QObject *)0x0);
  proxy1RowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
  proxy1RowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
  proxy1RowsAboutToBeInsertedSpy._8_8_ = 0;
  proxy1RowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  bVar1 = (bool)(**(code **)(_baseModel + 0x100))(&baseModel,0,1);
  cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0x1c9);
  if (cVar2 != '\0') {
    proxy1RowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
    proxy1RowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
    proxy1RowsAboutToBeInsertedSpy._8_8_ = 0;
    proxy1RowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
    bVar1 = (bool)QStandardItemModel::insertRows((int)&baseModel,0,(QModelIndex *)0x2);
    cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 2)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0x1ca);
    if (cVar2 != '\0') {
      proxy1RowsInsertedSpy.super_QObject = (QObject)0xff;
      proxy1RowsInsertedSpy._1_7_ = 0xffffffffffffff;
      proxy1RowsInsertedSpy._8_8_ = 0;
      proxy1RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
      QStandardItemModel::index
                ((int)&proxy1RowsAboutToBeInsertedSpy,(int)&baseModel,(QModelIndex *)0x0);
      bVar1 = (bool)(**(code **)(_baseModel + 0x100))
                              (&baseModel,0,1,&proxy1RowsAboutToBeInsertedSpy);
      cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(0, 0))","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0x1cb);
      if (cVar2 != '\0') {
        proxy1RowsInsertedSpy.super_QObject = (QObject)0xff;
        proxy1RowsInsertedSpy._1_7_ = 0xffffffffffffff;
        proxy1RowsInsertedSpy._8_8_ = 0;
        proxy1RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
        QStandardItemModel::index
                  ((int)&proxy1RowsAboutToBeInsertedSpy,(int)&baseModel,(QModelIndex *)0x0);
        bVar1 = (bool)QStandardItemModel::insertRows((int)&baseModel,0,(QModelIndex *)0x2);
        cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 2, baseModel.index(0, 0))","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0x1cc);
        if (cVar2 != '\0') {
          proxy1RowsInsertedSpy.super_QObject = (QObject)0xff;
          proxy1RowsInsertedSpy._1_7_ = 0xffffffffffffff;
          proxy1RowsInsertedSpy._8_8_ = 0;
          proxy1RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
          QStandardItemModel::index
                    ((int)&proxy1RowsAboutToBeInsertedSpy,(int)&baseModel,(QModelIndex *)0x1);
          bVar1 = (bool)(**(code **)(_baseModel + 0x100))
                                  (&baseModel,0,1,&proxy1RowsAboutToBeInsertedSpy);
          cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(1, 0))","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                 ,0x1cd);
          if (cVar2 != '\0') {
            proxy1RowsInsertedSpy.super_QObject = (QObject)0xff;
            proxy1RowsInsertedSpy._1_7_ = 0xffffffffffffff;
            proxy1RowsInsertedSpy._8_8_ = 0;
            proxy1RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
            QStandardItemModel::index
                      ((int)&proxy1RowsAboutToBeInsertedSpy,(int)&baseModel,(QModelIndex *)0x1);
            bVar1 = (bool)QStandardItemModel::insertRows((int)&baseModel,0,(QModelIndex *)0x1);
            cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 1, baseModel.index(1, 0))","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                   ,0x1ce);
            if (cVar2 != '\0') {
              proxy2RowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
              proxy2RowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
              proxy2RowsAboutToBeInsertedSpy._8_8_ = 0;
              proxy2RowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
              QStandardItemModel::index
                        ((int)&proxy1RowsInsertedSpy,(int)&baseModel,(QModelIndex *)0x0);
              QVariant::QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy,(QChar)0x41);
              bVar1 = (bool)QStandardItemModel::setData
                                      ((QModelIndex *)&baseModel,(QVariant *)&proxy1RowsInsertedSpy,
                                       (int)&proxy1RowsAboutToBeInsertedSpy);
              cVar2 = QTest::qVerify(bVar1,
                                     "baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char(\'A\')))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0x1cf);
              QVariant::~QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy);
              if (cVar2 != '\0') {
                proxy2RowsInsertedSpy.super_QObject = (QObject)0xff;
                proxy2RowsInsertedSpy._1_7_ = 0xffffffffffffff;
                proxy2RowsInsertedSpy._8_8_ = 0;
                proxy2RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                QStandardItemModel::index
                          ((int)&proxy2RowsAboutToBeInsertedSpy,(int)&baseModel,(QModelIndex *)0x0);
                QStandardItemModel::index
                          ((int)&proxy1RowsInsertedSpy,(int)&baseModel,(QModelIndex *)0x0);
                QVariant::QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy,(QChar)0x43);
                bVar1 = (bool)QStandardItemModel::setData
                                        ((QModelIndex *)&baseModel,
                                         (QVariant *)&proxy1RowsInsertedSpy,
                                         (int)&proxy1RowsAboutToBeInsertedSpy);
                cVar2 = QTest::qVerify(bVar1,
                                       "baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'C\')))"
                                       ,"",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                       ,0x1d0);
                QVariant::~QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy);
                if (cVar2 != '\0') {
                  proxy2RowsInsertedSpy.super_QObject = (QObject)0xff;
                  proxy2RowsInsertedSpy._1_7_ = 0xffffffffffffff;
                  proxy2RowsInsertedSpy._8_8_ = 0;
                  proxy2RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                  QStandardItemModel::index
                            ((int)&proxy2RowsAboutToBeInsertedSpy,(int)&baseModel,(QModelIndex *)0x0
                            );
                  QStandardItemModel::index
                            ((int)&proxy1RowsInsertedSpy,(int)&baseModel,(QModelIndex *)0x1);
                  QVariant::QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy,(QChar)0x44);
                  bVar1 = (bool)QStandardItemModel::setData
                                          ((QModelIndex *)&baseModel,
                                           (QVariant *)&proxy1RowsInsertedSpy,
                                           (int)&proxy1RowsAboutToBeInsertedSpy);
                  cVar2 = QTest::qVerify(bVar1,
                                         "baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'D\')))"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                         ,0x1d1);
                  QVariant::~QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy);
                  if (cVar2 != '\0') {
                    proxy2RowsAboutToBeInsertedSpy.super_QObject = (QObject)0xff;
                    proxy2RowsAboutToBeInsertedSpy._1_7_ = 0xffffffffffffff;
                    proxy2RowsAboutToBeInsertedSpy._8_8_ = 0;
                    proxy2RowsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                    QStandardItemModel::index
                              ((int)&proxy1RowsInsertedSpy,(int)&baseModel,(QModelIndex *)0x1);
                    QVariant::QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy,(QChar)0x42);
                    bVar1 = (bool)QStandardItemModel::setData
                                            ((QModelIndex *)&baseModel,
                                             (QVariant *)&proxy1RowsInsertedSpy,
                                             (int)&proxy1RowsAboutToBeInsertedSpy);
                    cVar2 = QTest::qVerify(bVar1,
                                           "baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char(\'B\')))"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                           ,0x1d2);
                    QVariant::~QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy);
                    if (cVar2 != '\0') {
                      proxy2RowsInsertedSpy.super_QObject = (QObject)0xff;
                      proxy2RowsInsertedSpy._1_7_ = 0xffffffffffffff;
                      proxy2RowsInsertedSpy._8_8_ = 0;
                      proxy2RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                      QStandardItemModel::index
                                ((int)&proxy2RowsAboutToBeInsertedSpy,(int)&baseModel,
                                 (QModelIndex *)0x1);
                      QStandardItemModel::index
                                ((int)&proxy1RowsInsertedSpy,(int)&baseModel,(QModelIndex *)0x0);
                      QVariant::QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy,(QChar)0x45);
                      bVar1 = (bool)QStandardItemModel::setData
                                              ((QModelIndex *)&baseModel,
                                               (QVariant *)&proxy1RowsInsertedSpy,
                                               (int)&proxy1RowsAboutToBeInsertedSpy);
                      cVar2 = QTest::qVerify(bVar1,
                                             "baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char(\'E\')))"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0x1d3);
                      QVariant::~QVariant((QVariant *)&proxy1RowsAboutToBeInsertedSpy);
                      if (cVar2 != '\0') {
                        RootIndexProxyModel::RootIndexProxyModel(&proxyModel1,(QObject *)0x0);
                        pMVar4 = (ModelTest *)operator_new(0x10);
                        ModelTest::ModelTest
                                  (pMVar4,(QAbstractItemModel *)&proxyModel1,(QObject *)&baseModel);
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel1);
                        proxy1RowsInsertedSpy.super_QObject = (QObject)0xff;
                        proxy1RowsInsertedSpy._1_7_ = 0xffffffffffffff;
                        proxy1RowsInsertedSpy._8_8_ = 0;
                        proxy1RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                        QStandardItemModel::index
                                  ((int)&proxy1RowsAboutToBeInsertedSpy,(int)&baseModel,
                                   (QModelIndex *)0x0);
                        RootIndexProxyModel::setRootIndex((QModelIndex *)&proxyModel1);
                        RootIndexProxyModel::RootIndexProxyModel(&proxyModel2,(QObject *)0x0);
                        pMVar4 = (ModelTest *)operator_new(0x10);
                        ModelTest::ModelTest
                                  (pMVar4,(QAbstractItemModel *)&proxyModel2,(QObject *)&baseModel);
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel2);
                        proxy1RowsInsertedSpy.super_QObject = (QObject)0xff;
                        proxy1RowsInsertedSpy._1_7_ = 0xffffffffffffff;
                        proxy1RowsInsertedSpy._8_8_ = 0;
                        proxy1RowsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                        QStandardItemModel::index
                                  ((int)&proxy1RowsAboutToBeInsertedSpy,(int)&baseModel,
                                   (QModelIndex *)0x1);
                        RootIndexProxyModel::setRootIndex((QModelIndex *)&proxyModel2);
                        QSignalSpy::QSignalSpy
                                  (&proxy1RowsAboutToBeInsertedSpy,(QObject *)&proxyModel1,
                                   "2rowsAboutToBeInserted(QModelIndex, int, int)");
                        cVar2 = QTest::qVerify(proxy1RowsAboutToBeInsertedSpy.sig.d.size != 0,
                                               "proxy1RowsAboutToBeInsertedSpy.isValid()","",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                               ,0x1dd);
                        if (cVar2 != '\0') {
                          QSignalSpy::QSignalSpy
                                    (&proxy1RowsInsertedSpy,(QObject *)&proxyModel1,
                                     "2rowsInserted(QModelIndex, int, int)");
                          cVar2 = QTest::qVerify(proxy1RowsInsertedSpy.sig.d.size != 0,
                                                 "proxy1RowsInsertedSpy.isValid()","",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                 ,0x1df);
                          if (cVar2 != '\0') {
                            QSignalSpy::QSignalSpy
                                      (&proxy2RowsAboutToBeInsertedSpy,(QObject *)&proxyModel2,
                                       "2rowsAboutToBeInserted(QModelIndex, int, int)");
                            cVar2 = QTest::qVerify(proxy2RowsAboutToBeInsertedSpy.sig.d.size != 0,
                                                   "proxy2RowsAboutToBeInsertedSpy.isValid()","",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e1);
                            if (cVar2 != '\0') {
                              QSignalSpy::QSignalSpy
                                        (&proxy2RowsInsertedSpy,(QObject *)&proxyModel2,
                                         "2rowsInserted(QModelIndex, int, int)");
                              cVar2 = QTest::qVerify(proxy2RowsInsertedSpy.sig.d.size != 0,
                                                     "proxy2RowsInsertedSpy.isValid()","",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e3);
                              if (cVar2 != '\0') {
                                QSignalSpy::QSignalSpy
                                          (&proxy1RowsAboutToBeRemovedSpy,(QObject *)&proxyModel1,
                                           "2rowsAboutToBeRemoved(QModelIndex, int, int)");
                                cVar2 = QTest::qVerify(proxy1RowsAboutToBeRemovedSpy.sig.d.size != 0
                                                       ,"proxy1RowsAboutToBeRemovedSpy.isValid()",""
                                                       ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e5);
                                if (cVar2 != '\0') {
                                  QSignalSpy::QSignalSpy
                                            (&proxy1RowsRemovedSpy,(QObject *)&proxyModel1,
                                             "2rowsRemoved(QModelIndex, int, int)");
                                  cVar2 = QTest::qVerify(proxy1RowsRemovedSpy.sig.d.size != 0,
                                                         "proxy1RowsRemovedSpy.isValid()","",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e7);
                                  if (cVar2 != '\0') {
                                    QSignalSpy::QSignalSpy
                                              (&proxy2RowsAboutToBeRemovedSpy,
                                               (QObject *)&proxyModel2,
                                               "2rowsAboutToBeRemoved(QModelIndex, int, int)");
                                    cVar2 = QTest::qVerify(proxy2RowsAboutToBeRemovedSpy.sig.d.size
                                                           != 0,
                                                  "proxy2RowsAboutToBeRemovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e9);
                                    if (cVar2 != '\0') {
                                      QSignalSpy::QSignalSpy
                                                (&proxy2RowsRemovedSpy,(QObject *)&proxyModel2,
                                                 "2rowsRemoved(QModelIndex, int, int)");
                                      cVar2 = QTest::qVerify(proxy2RowsRemovedSpy.sig.d.size != 0,
                                                             "proxy2RowsRemovedSpy.isValid()","",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1eb);
                                      if (cVar2 != '\0') {
                                        QSignalSpy::QSignalSpy
                                                  (&proxy1rowsMovedSpy,(QObject *)&proxyModel1,
                                                                                                      
                                                  "2rowsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                        cVar2 = QTest::qVerify(proxy1rowsMovedSpy.sig.d.size != 0,
                                                               "proxy1rowsMovedSpy.isValid()","",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ed);
                                        if (cVar2 != '\0') {
                                          QSignalSpy::QSignalSpy
                                                    (&proxy1rowsAboutToBeMovedSpy,
                                                     (QObject *)&proxyModel1,
                                                                                                          
                                                  "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                          cVar2 = QTest::qVerify(proxy1rowsAboutToBeMovedSpy.sig.d.
                                                                 size != 0,
                                                                                                                                  
                                                  "proxy1rowsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ef);
                                          if (cVar2 != '\0') {
                                            QSignalSpy::QSignalSpy
                                                      (&proxy2rowsMovedSpy,(QObject *)&proxyModel2,
                                                                                                              
                                                  "2rowsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                            cVar2 = QTest::qVerify(proxy2rowsMovedSpy.sig.d.size !=
                                                                   0,"proxy2rowsMovedSpy.isValid()",
                                                                   "",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f1);
                                            if (cVar2 != '\0') {
                                              QSignalSpy::QSignalSpy
                                                        (&proxy2rowsAboutToBeMovedSpy,
                                                         (QObject *)&proxyModel2,
                                                                                                                  
                                                  "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                              cVar2 = QTest::qVerify(proxy2rowsAboutToBeMovedSpy.sig
                                                                     .d.size != 0,
                                                                                                                                          
                                                  "proxy2rowsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,499);
                                              if (cVar2 != '\0') {
                                                QStandardItemModel::index
                                                          ((int)&local_640,(int)&baseModel,
                                                           (QModelIndex *)0x0);
                                                bVar1 = (bool)(**(code **)(_baseModel + 0xf8))
                                                                        (&baseModel,2,1,&local_640);
                                                cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.insertRow(2, baseModel.index(0, 0))",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,500);
                                                if (cVar2 != '\0') {
                                                  local_640 = 0xffffffffffffffff;
                                                  local_638 = 0;
                                                  uStack_630 = 0;
                                                  iVar3 = RootIndexProxyModel::rowCount
                                                                    ((QModelIndex *)&proxyModel1);
                                                  cVar2 = QTest::qCompare(iVar3,3,
                                                  "proxyModel1.rowCount()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f5);
                                                  if (cVar2 != '\0') {
                                                    local_640 = 0xffffffffffffffff;
                                                    local_638 = 0;
                                                    uStack_630 = 0;
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      ((QModelIndex *)&proxyModel2);
                                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.rowCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f6);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy2RowsAboutToBeInsertedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f7);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy2RowsInsertedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f8);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy1RowsAboutToBeRemovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f9);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy1RowsRemovedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fa);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy2RowsAboutToBeRemovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fb);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy2RowsRemovedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fc);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy1rowsAboutToBeMovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fd);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy1rowsMovedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fe);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy2rowsAboutToBeMovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ff);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy2rowsMovedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x200);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(
                                                  proxy1RowsAboutToBeInsertedSpy.
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1RowsAboutToBeInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x201);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(proxy1RowsInsertedSpy.
                                                                                                                                                        
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1RowsInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x202);
                                                  if (cVar2 != '\0') {
                                                    QList<QList<QVariant>_>::clear
                                                              (&proxy1RowsAboutToBeInsertedSpy.
                                                                super_QList<QList<QVariant>_>);
                                                    QList<QList<QVariant>_>::clear
                                                              (&proxy1RowsInsertedSpy.
                                                                super_QList<QList<QVariant>_>);
                                                    QStandardItemModel::index
                                                              ((int)&local_640,(int)&baseModel,
                                                               (QModelIndex *)0x0);
                                                    bVar1 = (bool)(**(code **)(_baseModel + 0x108))
                                                                            (&baseModel,2,1,
                                                                             &local_640);
                                                    cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.removeRow(2, baseModel.index(0, 0))",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x206);
                                                  if (cVar2 != '\0') {
                                                    local_640 = 0xffffffffffffffff;
                                                    local_638 = 0;
                                                    uStack_630 = 0;
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      ((QModelIndex *)&proxyModel1);
                                                    cVar2 = QTest::qCompare(iVar3,2,
                                                  "proxyModel1.rowCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x207);
                                                  if (cVar2 != '\0') {
                                                    local_640 = 0xffffffffffffffff;
                                                    local_638 = 0;
                                                    uStack_630 = 0;
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      ((QModelIndex *)&proxyModel2);
                                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.rowCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x208);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(
                                                  proxy1RowsAboutToBeRemovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1RowsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x209);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(
                                                  proxy1RowsAboutToBeRemovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1RowsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20a);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy1RowsAboutToBeInsertedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20b);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy1RowsInsertedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20c);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy2RowsAboutToBeInsertedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20d);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy2RowsInsertedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20e);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy2RowsAboutToBeRemovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20f);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy2RowsRemovedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x210);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy1rowsAboutToBeMovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x211);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy1rowsMovedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x212);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(
                                                  proxy2rowsAboutToBeMovedSpy.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x213);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(proxy2rowsMovedSpy.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x214);
                                                  if (cVar2 != '\0') {
                                                    QList<QList<QVariant>_>::clear
                                                              (&proxy1RowsAboutToBeRemovedSpy.
                                                                super_QList<QList<QVariant>_>);
                                                    QList<QList<QVariant>_>::clear
                                                              (&proxy1RowsAboutToBeRemovedSpy.
                                                                super_QList<QList<QVariant>_>);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              QSignalSpy::~QSignalSpy(&proxy2rowsAboutToBeMovedSpy);
                                            }
                                            QSignalSpy::~QSignalSpy(&proxy2rowsMovedSpy);
                                          }
                                          QSignalSpy::~QSignalSpy(&proxy1rowsAboutToBeMovedSpy);
                                        }
                                        QSignalSpy::~QSignalSpy(&proxy1rowsMovedSpy);
                                      }
                                      QSignalSpy::~QSignalSpy(&proxy2RowsRemovedSpy);
                                    }
                                    QSignalSpy::~QSignalSpy(&proxy2RowsAboutToBeRemovedSpy);
                                  }
                                  QSignalSpy::~QSignalSpy(&proxy1RowsRemovedSpy);
                                }
                                QSignalSpy::~QSignalSpy(&proxy1RowsAboutToBeRemovedSpy);
                              }
                              QSignalSpy::~QSignalSpy(&proxy2RowsInsertedSpy);
                            }
                            QSignalSpy::~QSignalSpy(&proxy2RowsAboutToBeInsertedSpy);
                          }
                          QSignalSpy::~QSignalSpy(&proxy1RowsInsertedSpy);
                        }
                        QSignalSpy::~QSignalSpy(&proxy1RowsAboutToBeInsertedSpy);
                        RootIndexProxyModel::~RootIndexProxyModel(&proxyModel2);
                        RootIndexProxyModel::~RootIndexProxyModel(&proxyModel1);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QStandardItemModel::~QStandardItemModel(&baseModel);
  return;
}

Assistant:

void tst_RootIndexProxyModel::bug53Rows()
{
#ifdef COMPLEX_MODEL_SUPPORT
    ComplexModel baseModel;
    QVERIFY(baseModel.insertColumn(0));
    QVERIFY(baseModel.insertRows(0, 2));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertRows(0, 2, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(1, 0)));
    QVERIFY(baseModel.insertRows(0, 1, baseModel.index(1, 0)));
    QVERIFY(baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char('A'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char('C'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char('D'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char('B'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char('E'))));
    RootIndexProxyModel proxyModel1;
    new ModelTest(&proxyModel1, &baseModel);
    proxyModel1.setSourceModel(&baseModel);
    proxyModel1.setRootIndex(baseModel.index(0, 0));
    RootIndexProxyModel proxyModel2;
    new ModelTest(&proxyModel2, &baseModel);
    proxyModel2.setSourceModel(&baseModel);
    proxyModel2.setRootIndex(baseModel.index(1, 0));
    QSignalSpy proxy1RowsAboutToBeInsertedSpy(&proxyModel1, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy1RowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy1RowsInsertedSpy(&proxyModel1, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxy1RowsInsertedSpy.isValid());
    QSignalSpy proxy2RowsAboutToBeInsertedSpy(&proxyModel2, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy2RowsInsertedSpy(&proxyModel2, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxy2RowsInsertedSpy.isValid());
    QSignalSpy proxy1RowsAboutToBeRemovedSpy(&proxyModel1, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1RowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy1RowsRemovedSpy(&proxyModel1, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1RowsRemovedSpy.isValid());
    QSignalSpy proxy2RowsAboutToBeRemovedSpy(&proxyModel2, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy2RowsRemovedSpy(&proxyModel2, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2RowsRemovedSpy.isValid());
    QSignalSpy proxy1rowsMovedSpy(&proxyModel1, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1rowsMovedSpy.isValid());
    QSignalSpy proxy1rowsAboutToBeMovedSpy(&proxyModel1, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isValid());
    QSignalSpy proxy2rowsMovedSpy(&proxyModel2, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2rowsMovedSpy.isValid());
    QSignalSpy proxy2rowsAboutToBeMovedSpy(&proxyModel2, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isValid());
    QVERIFY(baseModel.insertRow(2, baseModel.index(0, 0)));
    QCOMPARE(proxyModel1.rowCount(), 3);
    QCOMPARE(proxyModel2.rowCount(), 1);
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsInsertedSpy.isEmpty());
    QVERIFY(proxy1RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1RowsRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsRemovedSpy.isEmpty());
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1rowsMovedSpy.isEmpty());
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2rowsMovedSpy.isEmpty());
    QCOMPARE(proxy1RowsAboutToBeInsertedSpy.count(), 1);
    QCOMPARE(proxy1RowsInsertedSpy.count(), 1);
    proxy1RowsAboutToBeInsertedSpy.clear();
    proxy1RowsInsertedSpy.clear();

    QVERIFY(baseModel.removeRow(2, baseModel.index(0, 0)));
    QCOMPARE(proxyModel1.rowCount(), 2);
    QCOMPARE(proxyModel2.rowCount(), 1);
    QCOMPARE(proxy1RowsAboutToBeRemovedSpy.count(), 1);
    QCOMPARE(proxy1RowsAboutToBeRemovedSpy.count(), 1);
    QVERIFY(proxy1RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy1RowsInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsRemovedSpy.isEmpty());
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1rowsMovedSpy.isEmpty());
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2rowsMovedSpy.isEmpty());
    proxy1RowsAboutToBeRemovedSpy.clear();
    proxy1RowsAboutToBeRemovedSpy.clear();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}